

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.c
# Opt level: O1

union_tag * get_tag(int braces)

{
  char *pcVar1;
  byte *pbVar2;
  char cVar3;
  int lineno;
  uint uVar4;
  int iVar5;
  char *line;
  ushort **ppuVar6;
  union_tag *puVar7;
  ulong uVar8;
  char *cptr;
  
  cVar3 = *::cptr;
  uVar8 = (ulong)(uint)(int)cVar3;
  lineno = input_file->lineno;
  line = dup_line();
  cptr = line + ((long)::cptr - (long)::line);
  if (braces != 0) {
    if (cVar3 != '<') {
      illegal_tag(lineno,line,cptr);
    }
    ::cptr = ::cptr + 1;
    uVar4 = nextc();
    uVar8 = (ulong)uVar4;
    if (uVar4 == 0xffffffff) {
      unexpected_EOF();
      uVar8 = 0xffffffff;
    }
  }
  ppuVar6 = __ctype_b_loc();
  iVar5 = (int)uVar8;
  if (((((*ppuVar6)[iVar5] >> 10 & 1) == 0) && (iVar5 != 0x24)) && (iVar5 != 0x5f)) {
    illegal_tag(lineno,line,cptr);
  }
  cinc = 0;
  do {
    do {
      cachec((int)uVar8);
      pcVar1 = ::cptr + 1;
      pbVar2 = (byte *)(::cptr + 1);
      uVar8 = (ulong)(char)*pbVar2;
      ::cptr = pcVar1;
    } while (((*ppuVar6)[uVar8] & 8) != 0);
    uVar4 = *pbVar2 - 0x24;
  } while ((uVar4 < 0x3c) && ((0x800000000000401U >> ((ulong)uVar4 & 0x3f) & 1) != 0));
  if (braces != 0) {
    iVar5 = nextc();
    if (iVar5 != 0x3e) {
      if (iVar5 == -1) {
        unexpected_EOF();
      }
      illegal_tag(lineno,line,cptr);
    }
    ::cptr = ::cptr + 1;
  }
  free(line);
  havetags = 1;
  puVar7 = cache_tag(cache,cinc);
  return puVar7;
}

Assistant:

union_tag *get_tag(int braces)
{
    register int c = *cptr;
    int t_lineno = input_file->lineno;
    char *t_line = dup_line();
    char *t_cptr = t_line + (cptr - line);

    if (braces) {
	if (c != '<')
	    illegal_tag(t_lineno, t_line, t_cptr);
	++cptr;
	c = nextc();
	if (c == EOF) unexpected_EOF(); }
    if (!isalpha(c) && c != '_' && c != '$')
	illegal_tag(t_lineno, t_line, t_cptr);
    cinc = 0;
    do { cachec(c); c = *++cptr; } while (IS_IDENT(c));
    if (braces) {
	c = nextc();
	if (c == EOF) unexpected_EOF();
	if (c != '>')
	    illegal_tag(t_lineno, t_line, t_cptr);
	++cptr; }
    FREE(t_line);
    havetags = 1;
    return cache_tag(cache, cinc);
}